

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManCheckInv_rec(If_DsdMan_t *p,int iLit)

{
  int iVar1;
  If_DsdObj_t *pObj_00;
  bool bVar2;
  bool local_41;
  int local_30;
  int local_2c;
  int iFanin;
  int i;
  If_DsdObj_t *pObj;
  int iLit_local;
  If_DsdMan_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj_00 = If_DsdVecObj(&p->vObjs,iVar1);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 2) {
    p_local._4_4_ = 1;
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if ((iVar1 != 3) && (iVar1 = If_DsdObjType(pObj_00), iVar1 != 6)) {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 != 4) {
        iVar1 = If_DsdObjType(pObj_00);
        if (iVar1 == 5) {
          iVar1 = If_DsdManCheckInv_rec(p,*(int *)&pObj_00[1].field_0x4);
          local_41 = false;
          if (iVar1 != 0) {
            iVar1 = If_DsdManCheckInv_rec(p,pObj_00[2].Id);
            local_41 = iVar1 != 0;
          }
          return (uint)local_41;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5b7,"int If_DsdManCheckInv_rec(If_DsdMan_t *, int)");
      }
      local_2c = 0;
      while( true ) {
        iVar1 = If_DsdObjFaninNum(pObj_00);
        bVar2 = false;
        if (local_2c < iVar1) {
          local_30 = If_DsdObjFaninLit(pObj_00,local_2c);
          bVar2 = local_30 != 0;
        }
        if (!bVar2) break;
        iVar1 = If_DsdManCheckInv_rec(p,local_30);
        if (iVar1 != 0) {
          return 1;
        }
        local_2c = local_2c + 1;
      }
      return 0;
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int If_DsdManCheckInv_rec( If_DsdMan_t * p, int iLit )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 1;
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            if ( If_DsdManCheckInv_rec(p, iFanin) )
                return 1;
        return 0;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
        return If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]);
    assert( 0 );
    return 0;
}